

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O0

void __thiscall libtorrent::torrent_info::free_piece_layers(torrent_info *this)

{
  bitfield_flag<unsigned_char,_libtorrent::torrent_info_flags_tag,_void> f;
  torrent_info *this_local;
  
  ::std::
  vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
  ::clear(&(this->m_piece_layers).
           super_vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
         );
  ::std::
  vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
  ::shrink_to_fit(&(this->m_piece_layers).
                   super_vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
                 );
  f = libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::torrent_info_flags_tag,_void>::
      operator~(&v2_has_piece_hashes);
  libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::torrent_info_flags_tag,_void>::
  operator&=(&this->m_flags,f);
  return;
}

Assistant:

void torrent_info::free_piece_layers()
	{
		m_piece_layers.clear();
		m_piece_layers.shrink_to_fit();

		m_flags &= ~v2_has_piece_hashes;
	}